

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O0

BtorSimBitVector * btorsim_bv_ror(BtorSimBitVector *a,BtorSimBitVector *b)

{
  BtorSimBitVector *pBVar1;
  BtorSimBitVector *b_00;
  BtorSimBitVector *in_RSI;
  BtorSimBitVector *in_RDI;
  BtorSimBitVector *res;
  BtorSimBitVector *sll_part;
  BtorSimBitVector *srl_part;
  BtorSimBitVector *rev;
  BtorSimBitVector *rem;
  BtorSimBitVector *width;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  BtorSimBitVector *in_stack_ffffffffffffffc0;
  BtorSimBitVector *in_stack_ffffffffffffffc8;
  BtorSimBitVector *in_stack_ffffffffffffffd0;
  
  btorsim_bv_uint64_to_bv((uint64_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  btorsim_bv_urem(in_stack_ffffffffffffffc0,
                  (BtorSimBitVector *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
  ;
  pBVar1 = btorsim_bv_sub(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  b_00 = btorsim_bv_srl(in_RDI,in_RSI);
  pBVar1 = btorsim_bv_sll(pBVar1,b_00);
  pBVar1 = btorsim_bv_or(b_00,pBVar1);
  btorsim_bv_free((BtorSimBitVector *)0x13ac26);
  btorsim_bv_free((BtorSimBitVector *)0x13ac30);
  btorsim_bv_free((BtorSimBitVector *)0x13ac3a);
  btorsim_bv_free((BtorSimBitVector *)0x13ac44);
  return pBVar1;
}

Assistant:

BtorSimBitVector *
btorsim_bv_ror (const BtorSimBitVector *a, const BtorSimBitVector *b) {
  BtorSimBitVector *width = btorsim_bv_uint64_to_bv(a->width, a->width);
  BtorSimBitVector *rem = btorsim_bv_urem(b, width);
  BtorSimBitVector *rev = btorsim_bv_sub(width, rem);

  BtorSimBitVector *srl_part = btorsim_bv_srl(a, rem);
  BtorSimBitVector *sll_part = btorsim_bv_sll(a, rev);
  BtorSimBitVector *res = btorsim_bv_or(srl_part, sll_part);

  btorsim_bv_free(width);
  btorsim_bv_free(rev);
  btorsim_bv_free(srl_part);
  btorsim_bv_free(sll_part);
  return res;
}